

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O2

string * __thiscall
pfederc::NumberToken::toString_abi_cxx11_
          (string *__return_storage_ptr__,NumberToken *this,Lexer *lexer)

{
  allocator<char> local_31;
  string local_30;
  
  switch((this->super_Token).type) {
  case TOK_INT8:
    std::__cxx11::to_string(&local_30,(int)*(char *)&this->num);
    std::operator+(__return_storage_ptr__,&local_30,'s');
    break;
  case TOK_INT16:
    std::__cxx11::to_string(&local_30,(int)*(short *)&this->num);
    std::operator+(__return_storage_ptr__,&local_30,'S');
    break;
  case TOK_INT32:
    std::__cxx11::to_string(__return_storage_ptr__,(int)(this->num).f32);
    return __return_storage_ptr__;
  case TOK_INT64:
    std::__cxx11::to_string(&local_30,(this->num).i64);
    std::operator+(__return_storage_ptr__,&local_30,'L');
    break;
  case TOK_UINT8:
    std::__cxx11::to_string(&local_30,(uint)*(byte *)&this->num);
    std::operator+(__return_storage_ptr__,&local_30,"us");
    break;
  case TOK_UINT16:
    std::__cxx11::to_string(&local_30,(uint)*(ushort *)&this->num);
    std::operator+(__return_storage_ptr__,&local_30,"uS");
    break;
  case TOK_UINT32:
    std::__cxx11::to_string(&local_30,(uint)(this->num).f32);
    std::operator+(__return_storage_ptr__,&local_30,'u');
    break;
  case TOK_UINT64:
    std::__cxx11::to_string(&local_30,(this->num).u64);
    std::operator+(__return_storage_ptr__,&local_30,"uL");
    break;
  case TOK_FLT32:
    std::__cxx11::to_string(&local_30,(this->num).f32);
    std::operator+(__return_storage_ptr__,&local_30,'f');
    break;
  case TOK_FLT64:
    std::__cxx11::to_string(&local_30,(this->num).f64);
    std::operator+(__return_storage_ptr__,&local_30,'F');
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Unexpected number token type",&local_31);
    fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_lexer/src/token.cpp"
          ,0x17e,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_30);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string NumberToken::toString(const Lexer &lexer) const noexcept {
  switch(getType()) {
  case TokenType::TOK_INT8:
    return std::to_string(i8()) + 's';
  case TokenType::TOK_INT16:
    return std::to_string(i16()) + 'S';
  case TokenType::TOK_INT32:
    return std::to_string(i32());
  case TokenType::TOK_INT64:
    return std::to_string(i64()) + 'L';
  case TokenType::TOK_UINT8:
    return std::to_string(u8()) + "us";
  case TokenType::TOK_UINT16:
    return std::to_string(u16()) + "uS";
  case TokenType::TOK_UINT32:
    return std::to_string(u32()) + 'u';
  case TokenType::TOK_UINT64:
    return std::to_string(u64()) + "uL";
  case TokenType::TOK_FLT32:
    return std::to_string(f32()) + 'f';
  case TokenType::TOK_FLT64:
    return std::to_string(f64()) + 'F';
  default:
    fatal(__FILE__, __LINE__, "Unexpected number token type");
    return "";
  }
}